

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS UnmarshalList(JlDataObject *ListObject,JlMarshallElement *Description,
                       _Bool IgnoreExistingValuesInStruct,void *Output,void *ArrayCountPtr,
                       size_t ArrayCountSize,size_t *pErrorAtPos)

{
  JL_DATA_TYPE JVar1;
  size_t sVar2;
  void **listPtr_1;
  JlDataObject *pJStack_98;
  JL_DATA_TYPE objectType;
  JlDataObject *object;
  void *elementInArrayPtr;
  JlListItem *pJStack_80;
  uint32_t i;
  JlListItem *enumerator;
  size_t maxItemsInFixedArray;
  void *listAllocation;
  size_t allocSize;
  void **listPtr;
  size_t newCountValue;
  size_t originalCountValue;
  void *array;
  uint32_t listCount;
  JL_STATUS jlStatus;
  size_t ArrayCountSize_local;
  void *ArrayCountPtr_local;
  void *Output_local;
  JlMarshallElement *pJStack_18;
  _Bool IgnoreExistingValuesInStruct_local;
  JlMarshallElement *Description_local;
  JlDataObject *ListObject_local;
  
  _listCount = ArrayCountSize;
  ArrayCountSize_local = (size_t)ArrayCountPtr;
  ArrayCountPtr_local = Output;
  Output_local._7_1_ = IgnoreExistingValuesInStruct;
  pJStack_18 = Description;
  Description_local = (JlMarshallElement *)ListObject;
  array._0_4_ = JlGetListCount(ListObject);
  originalCountValue = 0;
  newCountValue = JlMemoryReadCountValue((void *)ArrayCountSize_local,_listCount);
  listPtr = (void **)0x0;
  JlMemoryWriteCountValue((void *)ArrayCountSize_local,_listCount,0);
  if (((Output_local._7_1_ & 1) == 0) && (newCountValue != 0)) {
    FreeUnmarshalledList(pJStack_18,ArrayCountPtr_local,newCountValue);
  }
  if ((uint32_t)array == 0) {
    if (pJStack_18->ArrayFieldSize == 0) {
      *(undefined8 *)ArrayCountPtr_local = 0;
    }
    else {
      memset(ArrayCountPtr_local,0,pJStack_18->ArrayFieldSize);
    }
    array._4_4_ = JL_STATUS_SUCCESS;
  }
  else {
    if (pJStack_18->ArrayFieldSize == 0) {
      allocSize = (size_t)ArrayCountPtr_local;
      listAllocation = (void *)(pJStack_18->ArrayItemSize * (ulong)(uint32_t)array);
      maxItemsInFixedArray = (size_t)WjTestLib_Calloc((size_t)listAllocation,1);
      if ((void *)maxItemsInFixedArray == (void *)0x0) {
        array._4_4_ = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        *(size_t *)allocSize = maxItemsInFixedArray;
        array._4_4_ = JL_STATUS_SUCCESS;
        originalCountValue = maxItemsInFixedArray;
      }
    }
    else {
      memset(ArrayCountPtr_local,0,pJStack_18->ArrayFieldSize);
      enumerator = (JlListItem *)(pJStack_18->ArrayFieldSize / pJStack_18->ArrayItemSize);
      if (enumerator < (JlListItem *)(ulong)(uint32_t)array) {
        array._4_4_ = JL_STATUS_TOO_MANY_ITEMS;
      }
      else {
        originalCountValue = (size_t)ArrayCountPtr_local;
        array._4_4_ = JL_STATUS_SUCCESS;
      }
    }
    if (array._4_4_ == JL_STATUS_SUCCESS) {
      pJStack_80 = (JlListItem *)0x0;
      for (elementInArrayPtr._4_4_ = 0;
          elementInArrayPtr._4_4_ < (uint32_t)array && array._4_4_ == JL_STATUS_SUCCESS;
          elementInArrayPtr._4_4_ = elementInArrayPtr._4_4_ + 1) {
        object = (JlDataObject *)
                 (originalCountValue + pJStack_18->ArrayItemSize * (ulong)elementInArrayPtr._4_4_);
        pJStack_98 = (JlDataObject *)0x0;
        array._4_4_ = JlGetObjectListNextItem
                                ((JlDataObject *)Description_local,&stack0xffffffffffffff68,
                                 &stack0xffffffffffffff80);
        if (array._4_4_ == JL_STATUS_SUCCESS) {
          JVar1 = JlGetObjectType(pJStack_98);
          if (pJStack_18->Type == JVar1) {
            array._4_4_ = UnmarshalObject(pJStack_98,pJStack_18,(_Bool)(Output_local._7_1_ & 1),
                                          object,pErrorAtPos);
            if (array._4_4_ == JL_STATUS_SUCCESS) {
              listPtr = (void **)((long)listPtr + 1);
              JlMemoryWriteCountValue((void *)ArrayCountSize_local,_listCount,(size_t)listPtr);
            }
          }
          else {
            array._4_4_ = JL_STATUS_WRONG_TYPE;
            if (pErrorAtPos != (size_t *)0x0) {
              sVar2 = JlGetObjectTag(pJStack_98);
              *pErrorAtPos = sVar2;
            }
          }
        }
      }
    }
  }
  if (((array._4_4_ != JL_STATUS_SUCCESS) && (pErrorAtPos != (size_t *)0x0)) && (*pErrorAtPos == 0))
  {
    sVar2 = JlGetObjectTag((JlDataObject *)Description_local);
    *pErrorAtPos = sVar2;
  }
  return array._4_4_;
}

Assistant:

static
JL_STATUS
    UnmarshalList
    (
        JlDataObject const*         ListObject,
        JlMarshallElement const*    Description,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Output,
        void*                       ArrayCountPtr,
        size_t                      ArrayCountSize,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus;
    uint32_t listCount = JlGetListCount( ListObject );
    void* array = NULL;

    // Get existing count value and then set to zero.
    size_t originalCountValue = JlMemoryReadCountValue( ArrayCountPtr, ArrayCountSize );
    size_t newCountValue = 0;
    (void) JlMemoryWriteCountValue( ArrayCountPtr, ArrayCountSize, newCountValue );

    // Check if there already is a list allocated and free it first.
    if( !IgnoreExistingValuesInStruct && originalCountValue > 0 )
    {
        // There is already a list allocated from a previous unmarshall, so we need to free that first.
        (void) FreeUnmarshalledList( Description, Output, originalCountValue );
    }

    if( listCount > 0 )
    {
        if( 0 == Description->ArrayFieldSize )
        {
            // We need to allocate the array of objects
            void** listPtr = Output;

            size_t allocSize = Description->ArrayItemSize * listCount;
            void* listAllocation = JlAlloc( allocSize );
            if( NULL != listAllocation )
            {
                *listPtr = listAllocation;
                array = listAllocation;
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            // Fixed array size in struct
            // Zero it first. ArrayFieldSize is the sizeof the entire fixed array
            memset( Output, 0, Description->ArrayFieldSize );

            // Determine if there is enough room.
            size_t maxItemsInFixedArray = Description->ArrayFieldSize / Description->ArrayItemSize;
            if( listCount <= maxItemsInFixedArray )
            {
                array = Output;
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                // More elements that we have room for.
                jlStatus = JL_STATUS_TOO_MANY_ITEMS;
            }
        }

        if( JL_STATUS_SUCCESS == jlStatus )
        {
            JlListItem* enumerator = NULL;
            for( uint32_t i=0; i<listCount  &&  JL_STATUS_SUCCESS==jlStatus; i++ )
            {
                void* elementInArrayPtr = ((uint8_t*)array) + (Description->ArrayItemSize * i);
                JlDataObject* object = NULL;
                jlStatus = JlGetObjectListNextItem( ListObject, &object, &enumerator );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    JL_DATA_TYPE objectType = JlGetObjectType( object );
                    if( Description->Type == objectType )
                    {
                        jlStatus = UnmarshalObject( object, Description, IgnoreExistingValuesInStruct, elementInArrayPtr, pErrorAtPos );
                        if( JL_STATUS_SUCCESS == jlStatus )
                        {
                            newCountValue += 1;
                            (void) JlMemoryWriteCountValue( ArrayCountPtr, ArrayCountSize, newCountValue );
                        }
                    }
                    else
                    {
                        // Wrong type in list. All elements must be of the same type to go into a C array.
                        jlStatus = JL_STATUS_WRONG_TYPE;
                        if( NULL != pErrorAtPos )
                        {
                            *pErrorAtPos = JlGetObjectTag( object );
                        }
                    }
                }
            }
        }
    }
    else
    {
        // List count is 0
        if( 0 == Description->ArrayFieldSize )
        {
            void** listPtr = Output;
            *listPtr = NULL;
        }
        else
        {
            // Fixed array size in struct
            memset( Output, 0, Description->ArrayFieldSize );
        }
        jlStatus = JL_STATUS_SUCCESS;
    }

    if(     JL_STATUS_SUCCESS != jlStatus
        &&  NULL != pErrorAtPos
        &&  0 == *pErrorAtPos )
    {
        // If we haven't already set an error position then use the position of this object (if it exists)
        *pErrorAtPos = JlGetObjectTag( ListObject );
    }

    return jlStatus;
}